

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O0

int lneedupdate(lua_State *L)

{
  void *pvVar1;
  ctrl *c;
  lua_State *L_local;
  
  pvVar1 = lua_touserdata(L,1);
  if (*(long *)((long)pvVar1 + 8) == 0) {
    L_local._4_4_ = 0;
  }
  else {
    lua_pushlightuserdata(L,*(void **)((long)pvVar1 + 8));
    lua_getuservalue(L,1);
    L_local._4_4_ = 2;
  }
  return L_local._4_4_;
}

Assistant:

static int
lneedupdate(lua_State *L) {
	struct ctrl * c = lua_touserdata(L, 1);
	if (c->update) {
		lua_pushlightuserdata(L, c->update);
		lua_getuservalue(L, 1);
		return 2;
	}
	return 0;
}